

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O3

void write_segment_id(AV1_COMP *cpi,MACROBLOCKD *xd,MB_MODE_INFO *mbmi,aom_writer *w,
                     segmentation *seg,segmentation_probs *segp,int skip_txfm)

{
  aom_cdf_prob *paVar1;
  _Bool _Var2;
  ushort uVar3;
  ushort uVar4;
  int iVar5;
  int iVar6;
  short sVar7;
  uint uVar8;
  uint uVar9;
  byte bVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  uint8_t *puVar19;
  aom_cdf_prob (*icdf) [9];
  
  if (seg->enabled == '\0') {
    return;
  }
  if (seg->update_map == '\0') {
    return;
  }
  iVar11 = 2 - (uint)(cpi->cyclic_refresh->skip_over4x4 == 0);
  iVar5 = xd->mi_row;
  iVar6 = xd->mi_col;
  puVar19 = ((cpi->common).cur_frame)->seg_map;
  _Var2 = xd->left_available;
  if (xd->up_available == false) {
    uVar8 = 0xff;
    uVar9 = 0xff;
    uVar13 = 0xff;
    if ((_Var2 & 1U) != 0) goto LAB_0019cc0a;
  }
  else {
    if ((_Var2 & 1U) == 0) {
      iVar16 = (cpi->common).mi_params.mi_rows;
      iVar14 = (cpi->common).mi_params.mi_cols;
      iVar17 = iVar5 - iVar11;
      uVar8 = 0xff;
    }
    else {
      iVar17 = iVar5 - iVar11;
      iVar16 = (cpi->common).mi_params.mi_rows;
      iVar14 = (cpi->common).mi_params.mi_cols;
      uVar8 = 8;
      if (iVar6 - iVar11 < iVar14 && iVar17 < iVar16) {
        bVar10 = 8;
        if (puVar19[iVar14 * iVar17 + (iVar6 - iVar11)] < 8) {
          bVar10 = puVar19[iVar14 * iVar17 + (iVar6 - iVar11)];
        }
        uVar8 = (uint)bVar10;
      }
    }
    if (iVar6 < iVar14 && iVar17 < iVar16) {
      uVar9 = 8;
      if (puVar19[iVar14 * iVar17 + iVar6] < 8) {
        uVar9 = (uint)puVar19[iVar14 * iVar17 + iVar6];
      }
    }
    else {
      uVar9 = 8;
    }
    uVar13 = 0xff;
    if ((_Var2 & 1U) != 0) {
LAB_0019cc0a:
      uVar13 = 8;
      if (iVar5 < (cpi->common).mi_params.mi_rows) {
        iVar16 = (cpi->common).mi_params.mi_cols;
        if (iVar6 - iVar11 < iVar16) {
          bVar10 = 8;
          if (puVar19[iVar16 * iVar5 + (iVar6 - iVar11)] < 8) {
            bVar10 = puVar19[iVar16 * iVar5 + (iVar6 - iVar11)];
          }
          uVar13 = (uint)bVar10;
        }
      }
    }
    if (uVar8 != 0xff) {
      if ((uVar8 != uVar9) || (uVar18 = 2, uVar12 = uVar8, uVar8 != uVar13)) {
        uVar18 = (ulong)((uVar13 == uVar9 || uVar8 == uVar13) || uVar8 == uVar9);
        uVar12 = uVar9;
      }
      goto LAB_0019cc92;
    }
  }
  uVar8 = 0xff;
  uVar18 = 0;
  uVar12 = uVar9;
LAB_0019cc92:
  if ((char)uVar9 == -1) {
    uVar9 = 0;
    if (uVar13 != 0xff) {
      uVar9 = uVar13;
    }
  }
  else if ((uVar13 != 0xff) && (uVar9 = uVar13, uVar8 == uVar12)) {
    uVar9 = uVar12;
  }
  if (skip_txfm == 0) {
    iVar11 = av1_neg_interleave(*(ushort *)&mbmi->field_0xa7 & 7,uVar9,seg->last_active_segid + 1);
    icdf = segp->spatial_pred_seg_cdf + uVar18;
    od_ec_encode_cdf_q15(&w->ec,iVar11,*icdf,8);
    if (w->allow_update_cdf != '\0') {
      uVar3 = segp->spatial_pred_seg_cdf[uVar18][8];
      bVar10 = (char)(uVar3 >> 4) + 5;
      lVar15 = 0;
      do {
        uVar4 = (*icdf)[lVar15];
        if (lVar15 < (char)iVar11) {
          sVar7 = (short)((int)(0x8000 - (uint)uVar4) >> (bVar10 & 0x1f));
        }
        else {
          sVar7 = -(uVar4 >> (bVar10 & 0x1f));
        }
        (*icdf)[lVar15] = sVar7 + uVar4;
        lVar15 = lVar15 + 1;
      } while (lVar15 != 7);
      paVar1 = segp->spatial_pred_seg_cdf[uVar18] + 8;
      *paVar1 = *paVar1 + (ushort)(uVar3 < 0x20);
    }
    uVar9 = (cpi->common).mi_params.mi_rows - iVar5;
    if ((int)(uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                   [mbmi->bsize] <= (int)uVar9) {
      uVar9 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                    [mbmi->bsize];
    }
    if (0 < (int)uVar9) {
      bVar10 = mbmi->field_0xa7;
      iVar11 = (cpi->common).mi_params.mi_cols;
      puVar19 = ((cpi->common).cur_frame)->seg_map + (iVar5 * iVar11 + iVar6);
      uVar8 = iVar11 - iVar6;
      if ((int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                     [mbmi->bsize] <= (int)uVar8) {
        uVar8 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                      [mbmi->bsize];
      }
      uVar18 = (ulong)uVar9;
      do {
        memset(puVar19,(uint)(bVar10 & 7),(long)(int)uVar8);
        puVar19 = puVar19 + iVar11;
        uVar18 = uVar18 - 1;
      } while (uVar18 != 0);
    }
  }
  else {
    uVar8 = (cpi->common).mi_params.mi_rows - iVar5;
    if ((int)(uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                   [mbmi->bsize] <= (int)uVar8) {
      uVar8 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                    [mbmi->bsize];
    }
    if (0 < (int)uVar8) {
      iVar11 = (cpi->common).mi_params.mi_cols;
      puVar19 = puVar19 + (iVar11 * iVar5 + iVar6);
      uVar13 = iVar11 - iVar6;
      if ((int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                     [mbmi->bsize] <= (int)uVar13) {
        uVar13 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                       [mbmi->bsize];
      }
      uVar18 = (ulong)uVar8;
      do {
        memset(puVar19,uVar9,(long)(int)uVar13);
        puVar19 = puVar19 + iVar11;
        uVar18 = uVar18 - 1;
      } while (uVar18 != 0);
      uVar8 = (cpi->common).mi_params.mi_rows - iVar5;
      if ((int)(uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                     [mbmi->bsize] <= (int)uVar8) {
        uVar8 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                      [mbmi->bsize];
      }
      if (0 < (int)uVar8) {
        iVar11 = (cpi->common).mi_params.mi_cols;
        puVar19 = (cpi->enc_seg).map + (iVar5 * iVar11 + iVar6);
        uVar13 = iVar11 - iVar6;
        if ((int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                       [mbmi->bsize] <= (int)uVar13) {
          uVar13 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                         [mbmi->bsize];
        }
        uVar18 = (ulong)uVar8;
        do {
          memset(puVar19,uVar9,(long)(int)uVar13);
          puVar19 = puVar19 + iVar11;
          uVar18 = uVar18 - 1;
        } while (uVar18 != 0);
      }
    }
    *(ushort *)&mbmi->field_0xa7 = *(ushort *)&mbmi->field_0xa7 & 0xfff8 | (ushort)((byte)uVar9 & 7)
    ;
  }
  return;
}

Assistant:

static inline void write_segment_id(AV1_COMP *cpi, MACROBLOCKD *const xd,
                                    const MB_MODE_INFO *const mbmi,
                                    aom_writer *w,
                                    const struct segmentation *seg,
                                    struct segmentation_probs *segp,
                                    int skip_txfm) {
  if (!seg->enabled || !seg->update_map) return;

  AV1_COMMON *const cm = &cpi->common;
  int cdf_num;
  const uint8_t pred = av1_get_spatial_seg_pred(
      cm, xd, &cdf_num, cpi->cyclic_refresh->skip_over4x4);
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;

  if (skip_txfm) {
    // Still need to transmit tx size for intra blocks even if skip_txfm is
    // true. Changing segment_id may make the tx size become invalid, e.g
    // changing from lossless to lossy.
    assert(is_inter_block(mbmi) || !cpi->enc_seg.has_lossless_segment);

    set_spatial_segment_id(&cm->mi_params, cm->cur_frame->seg_map, mbmi->bsize,
                           mi_row, mi_col, pred);
    set_spatial_segment_id(&cm->mi_params, cpi->enc_seg.map, mbmi->bsize,
                           mi_row, mi_col, pred);
    /* mbmi is read only but we need to update segment_id */
    ((MB_MODE_INFO *)mbmi)->segment_id = pred;
    return;
  }

  const int coded_id =
      av1_neg_interleave(mbmi->segment_id, pred, seg->last_active_segid + 1);
  aom_cdf_prob *pred_cdf = segp->spatial_pred_seg_cdf[cdf_num];
  aom_write_symbol(w, coded_id, pred_cdf, MAX_SEGMENTS);
  set_spatial_segment_id(&cm->mi_params, cm->cur_frame->seg_map, mbmi->bsize,
                         mi_row, mi_col, mbmi->segment_id);
}